

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atomic_guardedTests.cpp
# Opt level: O2

void __thiscall
atomic_guarded_atomci_guarded_1_Test::~atomic_guarded_atomci_guarded_1_Test
          (atomic_guarded_atomci_guarded_1_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(atomic_guarded, atomci_guarded_1)
{
    atomic_guarded<std::string> data("the key string");

    std::string val(data);

    EXPECT_EQ(val, "the key string");

    data.store("another string");
    EXPECT_EQ(data.load(), "another string");

    data = "yet another string";
    EXPECT_EQ(data.load(), "yet another string");

    EXPECT_EQ(data.exchange("string b"), "yet another string");

    std::string val2{"string2"};
    EXPECT_FALSE(data.compare_exchange(val2, "string 8"));
    EXPECT_EQ(val2, "string b");
    EXPECT_TRUE(data.compare_exchange(val2, "string 8"));
}